

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

void * gdImageGifAnimAddPtr
                 (gdImagePtr im,int *size,int LocalCM,int LeftOfs,int TopOfs,int Delay,int Disposal,
                 gdImagePtr previm)

{
  gdIOCtx *out_00;
  gdIOCtx *out;
  void *rv;
  int Delay_local;
  int TopOfs_local;
  int LeftOfs_local;
  int LocalCM_local;
  int *size_local;
  gdImagePtr im_local;
  
  out_00 = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out_00 == (gdIOCtx *)0x0) {
    im_local = (gdImagePtr)0x0;
  }
  else {
    gdImageGifAnimAddCtx(im,out_00,LocalCM,LeftOfs,TopOfs,Delay,Disposal,previm);
    im_local = (gdImagePtr)gdDPExtractData(out_00,size);
    (*out_00->gd_free)(out_00);
  }
  return im_local;
}

Assistant:

BGD_DECLARE(void *) gdImageGifAnimAddPtr(gdImagePtr im, int *size, int LocalCM,
                                         int LeftOfs, int TopOfs, int Delay,
                                         int Disposal, gdImagePtr previm)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	gdImageGifAnimAddCtx(im, out, LocalCM, LeftOfs, TopOfs, Delay, Disposal, previm);
	rv = gdDPExtractData(out, size);
	out->gd_free(out);
	return rv;
}